

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O2

unsigned_long lh_char_hash(void *k)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  if (lh_char_hash::random_seed == -1) {
    do {
      iVar1 = json_c_get_random_seed();
    } while (iVar1 == -1);
    LOCK();
    if (lh_char_hash::random_seed != -1) {
      iVar1 = lh_char_hash::random_seed;
    }
    lh_char_hash::random_seed = iVar1;
    UNLOCK();
  }
  sVar2 = strlen((char *)k);
  uVar5 = (int)sVar2 + lh_char_hash::random_seed + 0xdeadbeef;
  uVar8 = uVar5;
  uVar3 = uVar5;
  if (((ulong)k & 3) != 0) {
    if (((ulong)k & 1) != 0) {
      pbVar4 = (byte *)((long)k + 0xb);
      do {
        switch(sVar2) {
        case 0:
          goto switchD_001089af_caseD_0;
        case 0xc:
          uVar3 = uVar3 + (uint)*pbVar4 * 0x1000000;
        case 0xb:
          uVar3 = uVar3 + (uint)pbVar4[-1] * 0x10000;
        case 10:
          uVar3 = uVar3 + (uint)pbVar4[-2] * 0x100;
        case 9:
          uVar3 = uVar3 + pbVar4[-3];
        case 8:
          uVar8 = uVar8 + (uint)pbVar4[-4] * 0x1000000;
        case 7:
          uVar8 = uVar8 + (uint)pbVar4[-5] * 0x10000;
        case 6:
          uVar8 = uVar8 + (uint)pbVar4[-6] * 0x100;
        case 5:
          uVar8 = uVar8 + pbVar4[-7];
        case 4:
          uVar5 = uVar5 + (uint)pbVar4[-8] * 0x1000000;
        case 3:
          uVar5 = uVar5 + (uint)pbVar4[-9] * 0x10000;
        case 2:
          uVar5 = uVar5 + (uint)pbVar4[-10] * 0x100;
        case 1:
          uVar6 = (uint)pbVar4[-0xb];
          goto LAB_00108aa0;
        default:
          iVar1 = (uint)pbVar4[-4] * 0x1000000 + (uint)pbVar4[-5] * 0x10000 +
                  (uint)pbVar4[-6] * 0x100 + uVar8 + pbVar4[-7];
          uVar3 = (uint)*pbVar4 * 0x1000000 + (uint)pbVar4[-1] * 0x10000 +
                  (uint)pbVar4[-2] * 0x100 + uVar3 + pbVar4[-3];
          uVar8 = (uVar3 * 0x10 | uVar3 >> 0x1c) ^
                  ((uint)pbVar4[-8] * 0x1000000 + (uint)pbVar4[-9] * 0x10000 +
                  (uint)pbVar4[-10] * 0x100 + uVar5 + pbVar4[-0xb]) - uVar3;
          iVar7 = uVar3 + iVar1;
          uVar3 = (uVar8 << 6 | uVar8 >> 0x1a) ^ iVar1 - uVar8;
          iVar1 = uVar8 + iVar7;
          uVar8 = (uVar3 << 8 | uVar3 >> 0x18) ^ iVar7 - uVar3;
          iVar7 = uVar3 + iVar1;
          uVar5 = (uVar8 << 0x10 | uVar8 >> 0x10) ^ iVar1 - uVar8;
          iVar1 = uVar8 + iVar7;
          uVar8 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar7 - uVar5;
          uVar5 = uVar5 + iVar1;
          uVar3 = (uVar8 << 4 | uVar8 >> 0x1c) ^ iVar1 - uVar8;
          uVar8 = uVar8 + uVar5;
          sVar2 = sVar2 - 0xc;
          pbVar4 = pbVar4 + 0xc;
        }
      } while( true );
    }
LAB_001087d2:
    switch(sVar2) {
    case 0:
      goto switchD_001089af_caseD_0;
    case 1:
      uVar6 = (uint)(byte)*k;
      goto LAB_00108abb;
    case 2:
      goto switchD_001089af_caseD_2;
    case 3:
      uVar5 = uVar5 + (uint)*(byte *)((long)k + 2) * 0x10000;
      goto switchD_001089af_caseD_2;
    case 4:
      goto switchD_001089af_caseD_4;
    case 5:
      uVar6 = (uint)(byte)*(uint *)((long)k + 4);
      goto LAB_00108ab7;
    case 6:
      goto switchD_001089af_caseD_6;
    case 7:
      uVar8 = uVar8 + (uint)*(byte *)((long)k + 6) * 0x10000;
switchD_001089af_caseD_6:
      uVar6 = (uint)(ushort)*(uint *)((long)k + 4);
LAB_00108ab7:
      uVar8 = uVar8 + uVar6;
      goto switchD_001089af_caseD_4;
    case 8:
      break;
    case 9:
      uVar3 = uVar3 + (byte)*(uint *)((long)k + 8);
      break;
    case 10:
      goto switchD_001089af_caseD_a;
    case 0xb:
      uVar3 = uVar3 + (uint)*(byte *)((long)k + 10) * 0x10000;
switchD_001089af_caseD_a:
      uVar8 = uVar8 + *(uint *)((long)k + 4);
      uVar3 = uVar3 + (ushort)*(uint *)((long)k + 8);
      goto switchD_001089af_caseD_4;
    case 0xc:
      uVar3 = uVar3 + *(uint *)((long)k + 8);
      break;
    default:
      goto switchD_001089af_default;
    }
    uVar8 = uVar8 + *(uint *)((long)k + 4);
switchD_001089af_caseD_4:
    uVar6 = *k;
LAB_00108abb:
    uVar6 = uVar5 + uVar6;
    goto LAB_00108abd;
  }
LAB_00108844:
  switch(sVar2) {
  case 1:
    uVar6 = (uint)(byte)*k;
    goto LAB_00108aa0;
  case 2:
switchD_001089af_caseD_2:
    uVar6 = (uint)(ushort)*k;
LAB_00108aa0:
    uVar6 = uVar6 + uVar5;
LAB_00108abd:
    uVar5 = (uVar3 ^ uVar8) - (uVar8 << 0xe | uVar8 >> 0x12);
    uVar3 = (uVar6 ^ uVar5) - (uVar5 * 0x800 | uVar5 >> 0x15);
    uVar6 = (uVar8 ^ uVar3) - (uVar3 * 0x2000000 | uVar3 >> 7);
    uVar5 = (uVar5 ^ uVar6) - (uVar6 * 0x10000 | uVar6 >> 0x10);
    uVar8 = (uVar3 ^ uVar5) - (uVar5 * 0x10 | uVar5 >> 0x1c);
    uVar8 = (uVar6 ^ uVar8) - (uVar8 * 0x4000 | uVar8 >> 0x12);
    uVar3 = (uVar5 ^ uVar8) - (uVar8 * 0x1000000 | uVar8 >> 8);
  case 0:
switchD_001089af_caseD_0:
    return (ulong)uVar3;
  case 3:
    uVar6 = *k & 0xffffff;
    goto LAB_00108aa0;
  case 4:
    goto switchD_001088bc_caseD_4;
  case 5:
    uVar6 = (uint)(byte)*(uint *)((long)k + 4);
    break;
  case 6:
    uVar6 = (uint)(ushort)*(uint *)((long)k + 4);
    break;
  case 7:
    uVar6 = *(uint *)((long)k + 4) & 0xffffff;
    break;
  case 8:
    goto switchD_001088bc_caseD_8;
  case 9:
    uVar6 = (uint)(byte)*(uint *)((long)k + 8);
    goto LAB_00108a67;
  case 10:
    uVar6 = (uint)(ushort)*(uint *)((long)k + 8);
    goto LAB_00108a67;
  case 0xb:
    uVar6 = *(uint *)((long)k + 8) & 0xffffff;
LAB_00108a67:
    uVar3 = uVar3 + uVar6;
switchD_001088bc_caseD_8:
    uVar8 = uVar8 + *(uint *)((long)k + 4);
    goto switchD_001088bc_caseD_4;
  case 0xc:
    uVar3 = uVar3 + *(uint *)((long)k + 8);
    goto switchD_001088bc_caseD_8;
  default:
    goto switchD_001088bc_default;
  }
  uVar8 = uVar8 + uVar6;
switchD_001088bc_caseD_4:
  uVar6 = *k;
  goto LAB_00108aa0;
switchD_001089af_default:
  uVar3 = uVar3 + *(uint *)((long)k + 8);
  uVar5 = (uVar3 * 0x10 | uVar3 >> 0x1c) ^ (uVar5 + *k) - uVar3;
  iVar1 = uVar3 + uVar8 + *(uint *)((long)k + 4);
  uVar8 = (uVar5 << 6 | uVar5 >> 0x1a) ^ (uVar8 + *(uint *)((long)k + 4)) - uVar5;
  iVar7 = uVar5 + iVar1;
  uVar3 = (uVar8 << 8 | uVar8 >> 0x18) ^ iVar1 - uVar8;
  iVar1 = uVar8 + iVar7;
  uVar5 = (uVar3 << 0x10 | uVar3 >> 0x10) ^ iVar7 - uVar3;
  iVar7 = uVar3 + iVar1;
  uVar3 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar1 - uVar5;
  uVar5 = uVar5 + iVar7;
  sVar2 = sVar2 - 0xc;
  k = (void *)((long)k + 0xc);
  uVar8 = uVar3 + uVar5;
  uVar3 = (uVar3 << 4 | uVar3 >> 0x1c) ^ iVar7 - uVar3;
  goto LAB_001087d2;
switchD_001088bc_default:
  uVar3 = uVar3 + *(uint *)((long)k + 8);
  uVar5 = (uVar3 * 0x10 | uVar3 >> 0x1c) ^ (uVar5 + *k) - uVar3;
  iVar1 = uVar3 + uVar8 + *(uint *)((long)k + 4);
  uVar8 = (uVar5 << 6 | uVar5 >> 0x1a) ^ (uVar8 + *(uint *)((long)k + 4)) - uVar5;
  iVar7 = uVar5 + iVar1;
  uVar3 = (uVar8 << 8 | uVar8 >> 0x18) ^ iVar1 - uVar8;
  iVar1 = uVar8 + iVar7;
  uVar5 = (uVar3 << 0x10 | uVar3 >> 0x10) ^ iVar7 - uVar3;
  iVar7 = uVar3 + iVar1;
  uVar3 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar1 - uVar5;
  uVar5 = uVar5 + iVar7;
  sVar2 = sVar2 - 0xc;
  k = (void *)((long)k + 0xc);
  uVar8 = uVar3 + uVar5;
  uVar3 = (uVar3 << 4 | uVar3 >> 0x1c) ^ iVar7 - uVar3;
  goto LAB_00108844;
}

Assistant:

static unsigned long lh_char_hash(const void *k)
{
#if defined _MSC_VER || defined __MINGW32__
#define RANDOM_SEED_TYPE LONG
#else
#define RANDOM_SEED_TYPE int
#endif
	static volatile RANDOM_SEED_TYPE random_seed = -1;

	if (random_seed == -1)
	{
		RANDOM_SEED_TYPE seed;
		/* we can't use -1 as it is the uninitialized sentinel */
		while ((seed = json_c_get_random_seed()) == -1) {}
#if SIZEOF_INT == 8 && defined __GCC_HAVE_SYNC_COMPARE_AND_SWAP_8
#define USE_SYNC_COMPARE_AND_SWAP 1
#endif
#if SIZEOF_INT == 4 && defined __GCC_HAVE_SYNC_COMPARE_AND_SWAP_4
#define USE_SYNC_COMPARE_AND_SWAP 1
#endif
#if SIZEOF_INT == 2 && defined __GCC_HAVE_SYNC_COMPARE_AND_SWAP_2
#define USE_SYNC_COMPARE_AND_SWAP 1
#endif
#if defined USE_SYNC_COMPARE_AND_SWAP
		(void)__sync_val_compare_and_swap(&random_seed, -1, seed);
#elif defined _MSC_VER || defined __MINGW32__
		InterlockedCompareExchange(&random_seed, seed, -1);
#else
		//#warning "racy random seed initialization if used by multiple threads"
		random_seed = seed; /* potentially racy */
#endif
	}

	return hashlittle((const char *)k, strlen((const char *)k), (uint32_t)random_seed);
}